

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  ulong uVar1;
  WhereTerm *pWVar2;
  bool bVar3;
  uint in_EAX;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  undefined6 in_register_00000012;
  ulong uVar8;
  WhereTerm *pWVar9;
  uint uVar10;
  int k;
  uint local_38;
  uint local_34;
  
  uVar8 = CONCAT62(in_register_00000012,nRow);
  if (pWC->nTerm < 1) {
    uVar10 = 0;
  }
  else {
    local_34 = (uint)uVar8;
    uVar8 = pLoop->maskSelf;
    uVar1 = pLoop->prereq;
    pWVar9 = pWC->a;
    uVar10 = 0;
    iVar7 = pWC->nTerm;
    local_38 = in_EAX;
    do {
      if ((pWVar9->wtFlags & 2) != 0) break;
      if (((pLoop->maskSelf & pWVar9->prereqAll) != 0) &&
         ((pWVar9->prereqAll & ~(uVar8 | uVar1)) == 0)) {
        uVar5 = (ulong)pLoop->nLTerm;
        if (uVar5 != 0) {
          do {
            pWVar2 = pLoop->aLTerm[uVar5 - 1];
            if ((pWVar2 != (WhereTerm *)0x0) &&
               ((pWVar2 == pWVar9 ||
                ((-1 < (long)pWVar2->iParent && (pWC->a + pWVar2->iParent == pWVar9))))))
            goto LAB_001811fa;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        if (pWVar9->truthProb < 1) {
          pLoop->nOut = pLoop->nOut + pWVar9->truthProb;
        }
        else {
          pLoop->nOut = pLoop->nOut + -1;
          if ((pWVar9->eOperator & 0x82) != 0) {
            iVar4 = sqlite3ExprIsInteger(pWVar9->pExpr->pRight,(int *)&local_38);
            uVar6 = local_38 + 1;
            local_38 = 0x14;
            if (uVar6 < 3) {
              local_38 = 10;
            }
            if (iVar4 == 0) {
              local_38 = 0x14;
            }
            if (uVar10 < local_38) {
              uVar10 = local_38;
            }
          }
        }
      }
LAB_001811fa:
      pWVar9 = pWVar9 + 1;
      bVar3 = 1 < iVar7;
      iVar7 = iVar7 + -1;
    } while (bVar3);
    uVar8 = (ulong)local_34;
  }
  iVar7 = (int)(short)uVar8 - uVar10;
  if (iVar7 < pLoop->nOut) {
    pLoop->nOut = (LogEst)iVar7;
  }
  return;
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j, k;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nTerm, pTerm=pWC->a; i>0; i--, pTerm++){
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) break;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( pTerm->eOperator&(WO_EQ|WO_IS) ){
          Expr *pRight = pTerm->pExpr->pRight;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ) iReduce = k;
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce )  pLoop->nOut = nRow - iReduce;
}